

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void dumpString(DumpState *D,TString *ts)

{
  byte bVar1;
  char **b;
  TString *x_;
  size_t sVar2;
  TValue idx;
  TValue value;
  TValue key;
  
  if (ts != (TString *)0x0) {
    bVar1 = luaH_getstr(D->h,ts,&idx);
    if ((bVar1 & 0xf) == 0) {
      sVar2 = (size_t)ts->shrlen;
      if ((long)sVar2 < 0) {
        sVar2 = (ts->u).lnglen;
        b = (char **)ts->contents;
      }
      else {
        b = &ts->contents;
      }
      dumpVarint(D,sVar2 + 2);
      dumpBlock(D,b,sVar2 + 1);
      value.value_.gc = (GCObject *)(D->nstr + 1);
      D->nstr = (lua_Integer)value.value_;
      key.tt_ = ts->tt | 0x40;
      value.tt_ = '\x03';
      key.value_ = (Value)ts;
      luaH_set(D->L,D->h,&key,&value);
    }
    else {
      dumpVarint(D,1);
      dumpVarint(D,idx.value_.i);
    }
    return;
  }
  dumpVarint(D,0);
  return;
}

Assistant:

static void dumpString (DumpState *D, TString *ts) {
  if (ts == NULL)
    dumpSize(D, 0);
  else {
    TValue idx;
    int tag = luaH_getstr(D->h, ts, &idx);
    if (!tagisempty(tag)) {  /* string already saved? */
      dumpSize(D, 1);  /* reuse a saved string */
      dumpSize(D, cast_sizet(ivalue(&idx)));  /* index of saved string */
    }
    else {  /* must write and save the string */
      TValue key, value;  /* to save the string in the hash */
      size_t size;
      const char *s = getlstr(ts, size);
      dumpSize(D, size + 2);
      dumpVector(D, s, size + 1);  /* include ending '\0' */
      D->nstr++;  /* one more saved string */
      setsvalue(D->L, &key, ts);  /* the string is the key */
      setivalue(&value, D->nstr);  /* its index is the value */
      luaH_set(D->L, D->h, &key, &value);  /* h[ts] = nstr */
      /* integer value does not need barrier */
    }
  }
}